

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O0

void __thiscall
JtagAnalyzerResults::GenerateExportFile
          (JtagAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  undefined2 uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulonglong uVar5;
  ostream *poVar6;
  pointer pJVar7;
  char *pcVar8;
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  JtagShiftedData local_418;
  pointer puStack_3e0;
  JtagTAPState tap_state;
  undefined2 local_3c0;
  ulong local_3b8;
  U64 fcnt;
  U64 num_frames;
  string tdo_count_str;
  string local_388 [8];
  string tdi_count_str;
  string local_368 [8];
  string tdo_str;
  string local_348 [8];
  string tdi_str;
  char local_328 [8];
  char time_str [128];
  iterator sdi;
  JtagShiftedData sd;
  Frame frm;
  byte local_248;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  JtagAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar5 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  if ((this->mSettings->mShowBitCount & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&trigger_sample,"Time [s];TAP state;TDI;TDO");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar6 = std::operator<<((ostream *)&trigger_sample,
                             "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  Frame::Frame((Frame *)&sd.mTdoBits.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  JtagShiftedData::JtagShiftedData((JtagShiftedData *)&sdi);
  std::_Rb_tree_const_iterator<JtagShiftedData>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<JtagShiftedData> *)(time_str + 0x78));
  std::__cxx11::string::string(local_348);
  std::__cxx11::string::string(local_368);
  std::__cxx11::string::string(local_388);
  std::__cxx11::string::string((string *)&num_frames);
  fcnt = AnalyzerResults::GetNumFrames();
  for (local_3b8 = 0; local_3b8 < fcnt; local_3b8 = local_3b8 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&stack0xfffffffffffffc20);
    uVar1 = local_3c0;
    sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puStack_3e0;
    Frame::~Frame((Frame *)&stack0xfffffffffffffc20);
    AnalyzerHelpers::GetTimeString
              ((ulonglong)
               sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,uVar5,uVar4,local_328,0x80);
    local_248 = (byte)uVar1;
    local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (JtagTAPState)local_248;
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    if ((local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == ShiftIR) ||
       (local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._4_4_ == ShiftDR)) {
      sdi._M_node = (_Base_ptr)
                    sd.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)std::
                    set<JtagShiftedData,_std::less<JtagShiftedData>,_std::allocator<JtagShiftedData>_>
                    ::find(&this->mShiftedData,(key_type *)&sdi);
      time_str._120_8_ =
           local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_418.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)std::
                    set<JtagShiftedData,_std::less<JtagShiftedData>,_std::allocator<JtagShiftedData>_>
                    ::end(&this->mShiftedData);
      bVar2 = std::operator!=((_Self *)(time_str + 0x78),(_Self *)&local_418.mTdoBits);
      if (bVar2) {
        pJVar7 = std::_Rb_tree_const_iterator<JtagShiftedData>::operator->
                           ((_Rb_tree_const_iterator<JtagShiftedData> *)(time_str + 0x78));
        JtagShiftedData::GetTDIString_abi_cxx11_
                  ((JtagShiftedData *)(local_438 + 0x20),(DisplayBase)pJVar7,display_base);
        std::__cxx11::string::operator=(local_348,(string *)(local_438 + 0x20));
        std::__cxx11::string::~string((string *)(local_438 + 0x20));
        pJVar7 = std::_Rb_tree_const_iterator<JtagShiftedData>::operator->
                           ((_Rb_tree_const_iterator<JtagShiftedData> *)(time_str + 0x78));
        JtagShiftedData::GetTDOString_abi_cxx11_
                  ((JtagShiftedData *)local_438,(DisplayBase)pJVar7,display_base);
        std::__cxx11::string::operator=(local_368,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        if ((this->mSettings->mShowBitCount & 1U) != 0) {
          pJVar7 = std::_Rb_tree_const_iterator<JtagShiftedData>::operator->
                             ((_Rb_tree_const_iterator<JtagShiftedData> *)(time_str + 0x78));
          JtagShiftedData::GetTDILengthString_abi_cxx11_
                    ((JtagShiftedData *)local_458,SUB81(pJVar7,0));
          std::__cxx11::string::operator=(local_388,(string *)local_458);
          std::__cxx11::string::~string((string *)local_458);
          pJVar7 = std::_Rb_tree_const_iterator<JtagShiftedData>::operator->
                             ((_Rb_tree_const_iterator<JtagShiftedData> *)(time_str + 0x78));
          JtagShiftedData::GetTDOLengthString_abi_cxx11_
                    ((JtagShiftedData *)local_478,SUB81(pJVar7,0));
          std::__cxx11::string::operator=((string *)&num_frames,(string *)local_478);
          std::__cxx11::string::~string((string *)local_478);
        }
      }
    }
    if ((this->mSettings->mShowBitCount & 1U) == 0) {
      poVar6 = std::operator<<((ostream *)&trigger_sample,local_328);
      poVar6 = std::operator<<(poVar6,";");
      pcVar8 = GetStateDescLong(local_418.mTdoBits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,local_348);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,local_368);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar6 = std::operator<<((ostream *)&trigger_sample,local_328);
      poVar6 = std::operator<<(poVar6,";");
      pcVar8 = GetStateDescLong(local_418.mTdoBits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,local_348);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,local_368);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,local_388);
      poVar6 = std::operator<<(poVar6,";");
      poVar6 = std::operator<<(poVar6,(string *)&num_frames);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    bVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_3b8);
    if ((bVar3 & 1) != 0) goto LAB_00114f0b;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,fcnt);
LAB_00114f0b:
  std::__cxx11::string::~string((string *)&num_frames);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_348);
  JtagShiftedData::~JtagShiftedData((JtagShiftedData *)&sdi);
  Frame::~Frame((Frame *)&sd.mTdoBits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void JtagAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( mSettings->mShowBitCount )
        file_stream << "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount" << std::endl;
    else
        file_stream << "Time [s];TAP state;TDI;TDO" << std::endl;

    Frame frm;
    JtagShiftedData sd;
    std::set<JtagShiftedData>::iterator sdi;
    char time_str[ 128 ];
    std::string tdi_str, tdo_str, tdi_count_str, tdo_count_str;
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        frm = GetFrame( fcnt );

        // make the time string
        AnalyzerHelpers::GetTimeString( frm.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // get the TAP state
        JtagTAPState tap_state = ( JtagTAPState )frm.mType;

        // make the TDI/TDO data if we're in a shift state
        tdi_str.clear();
        tdo_str.clear();
        tdi_count_str.clear();
        tdo_count_str.clear();
        if( tap_state == ShiftIR || tap_state == ShiftDR )
        {
            // find TDI/TDO data
            sd.mStartSampleIndex = frm.mStartingSampleInclusive;
            sdi = mShiftedData.find( sd );

            // found?
            if( sdi != mShiftedData.end() )
            {
                tdi_str = sdi->GetTDIString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );
                tdo_str = sdi->GetTDOString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );

                if( mSettings->mShowBitCount )
                {
                    tdi_count_str = sdi->GetTDILengthString( false );
                    tdo_count_str = sdi->GetTDOLengthString( false );
                }
            }
        }

        // output
        if( mSettings->mShowBitCount )
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << ";" << tdi_count_str
                        << ";" << tdo_count_str << std::endl;
        else
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << std::endl;

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}